

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void MOJOSHADER_freeEffect(MOJOSHADER_effect *_effect)

{
  MOJOSHADER_effectParam *value;
  MOJOSHADER_effectTechnique *pMVar1;
  MOJOSHADER_effectPass *pMVar2;
  uint uVar3;
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *d;
  MOJOSHADER_effectParam *pMVar4;
  MOJOSHADER_effectObject *pMVar5;
  MOJOSHADER_parseData *_data;
  long lVar6;
  MOJOSHADER_effect *effect;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  if (_effect == &MOJOSHADER_out_of_mem_effect || _effect == (MOJOSHADER_effect *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = _effect->free;
  d = _effect->malloc_data;
  if (0 < _effect->error_count) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_effect->errors->error + lVar9),d);
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_effect->errors->filename + lVar9),d);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar7 < _effect->error_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_effect->errors,d);
  (*UNRECOVERED_JUMPTABLE)(_effect->profile,d);
  if (0 < _effect->param_count) {
    lVar7 = 0;
    do {
      pMVar4 = _effect->params;
      value = pMVar4 + lVar7;
      freevalue(&value->value,UNRECOVERED_JUMPTABLE,d);
      if (pMVar4[lVar7].annotation_count != 0) {
        lVar9 = 0;
        uVar8 = 0;
        do {
          freevalue((MOJOSHADER_effectValue *)((long)&value->annotations->name + lVar9),
                    UNRECOVERED_JUMPTABLE,d);
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x40;
        } while (uVar8 < value->annotation_count);
      }
      (*UNRECOVERED_JUMPTABLE)(value->annotations,d);
      lVar7 = lVar7 + 1;
    } while (lVar7 < _effect->param_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_effect->params,d);
  if (0 < _effect->technique_count) {
    lVar7 = 0;
    do {
      pMVar1 = _effect->techniques + lVar7;
      (*UNRECOVERED_JUMPTABLE)(pMVar1->name,d);
      if (pMVar1->pass_count != 0) {
        uVar8 = 0;
        do {
          pMVar2 = pMVar1->passes + uVar8;
          (*UNRECOVERED_JUMPTABLE)(pMVar2->name,d);
          if (pMVar2->state_count != 0) {
            lVar9 = 8;
            uVar10 = 0;
            do {
              freevalue((MOJOSHADER_effectValue *)((long)&pMVar2->states->type + lVar9),
                        UNRECOVERED_JUMPTABLE,d);
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 0x48;
            } while (uVar10 < pMVar2->state_count);
          }
          (*UNRECOVERED_JUMPTABLE)(pMVar2->states,d);
          if (pMVar2->annotation_count != 0) {
            lVar9 = 0;
            uVar10 = 0;
            do {
              freevalue((MOJOSHADER_effectValue *)((long)&pMVar2->annotations->name + lVar9),
                        UNRECOVERED_JUMPTABLE,d);
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 0x40;
            } while (uVar10 < pMVar2->annotation_count);
          }
          (*UNRECOVERED_JUMPTABLE)(pMVar2->annotations,d);
          uVar8 = uVar8 + 1;
        } while (uVar8 < pMVar1->pass_count);
      }
      (*UNRECOVERED_JUMPTABLE)(pMVar1->passes,d);
      if (pMVar1->annotation_count != 0) {
        lVar9 = 0;
        uVar8 = 0;
        do {
          freevalue((MOJOSHADER_effectValue *)((long)&pMVar1->annotations->name + lVar9),
                    UNRECOVERED_JUMPTABLE,d);
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x40;
        } while (uVar8 < pMVar1->annotation_count);
      }
      (*UNRECOVERED_JUMPTABLE)(pMVar1->annotations,d);
      lVar7 = lVar7 + 1;
    } while (lVar7 < _effect->technique_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_effect->techniques,d);
  if (0 < _effect->object_count) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      pMVar5 = _effect->objects;
      uVar3 = *(uint *)((long)pMVar5 + lVar9);
      if (uVar3 < 0x11) {
        lVar6 = 8;
        if ((0x7c10U >> (uVar3 & 0x1f) & 1) == 0) {
          if ((0x18000U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_00128118;
          _data = *(MOJOSHADER_parseData **)((long)pMVar5 + lVar9 + 0x40);
          if (*(int *)((long)pMVar5 + lVar9 + 0xc) == 0) {
            MOJOSHADER_freeParseData(_data);
          }
          else {
            MOJOSHADER_freePreshader((MOJOSHADER_preshader *)_data);
          }
          (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar5 + lVar9 + 0x28),d);
          (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar5 + lVar9 + 0x38),d);
          lVar6 = 0x18;
        }
        (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar5 + lVar9 + lVar6),d);
      }
LAB_00128118:
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x48;
    } while (lVar7 < _effect->object_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_effect->objects,d);
  (*UNRECOVERED_JUMPTABLE)(_effect,d);
  return;
}

Assistant:

void MOJOSHADER_freeEffect(const MOJOSHADER_effect *_effect)
{
    MOJOSHADER_effect *effect = (MOJOSHADER_effect *) _effect;
    if ((effect == NULL) || (effect == &MOJOSHADER_out_of_mem_effect))
        return;  // no-op.

    MOJOSHADER_free f = effect->free;
    void *d = effect->malloc_data;
    int i, j, k;

    /* Free errors */
    for (i = 0; i < effect->error_count; i++)
    {
        f((void *) effect->errors[i].error, d);
        f((void *) effect->errors[i].filename, d);
    } // for
    f((void *) effect->errors, d);

    /* Free profile string */
    f((void *) effect->profile, d);

    /* Free parameters, including annotations */
    for (i = 0; i < effect->param_count; i++)
    {
        MOJOSHADER_effectParam *param = &effect->params[i];
        freevalue(&param->value, f, d);
        for (j = 0; j < param->annotation_count; j++)
        {
            freevalue(&param->annotations[j], f, d);
        } // for
        f((void *) param->annotations, d);
    } // for
    f((void *) effect->params, d);

    /* Free techniques, including passes and all annotations */
    for (i = 0; i < effect->technique_count; i++)
    {
        MOJOSHADER_effectTechnique *technique = &effect->techniques[i];
        f((void *) technique->name, d);
        for (j = 0; j < technique->pass_count; j++)
        {
            MOJOSHADER_effectPass *pass = &technique->passes[j];
            f((void *) pass->name, d);
            for (k = 0; k < pass->state_count; k++)
            {
                freevalue(&pass->states[k].value, f, d);
            } // for
            f((void *) pass->states, d);
            for (k = 0; k < pass->annotation_count; k++)
            {
                freevalue(&pass->annotations[k], f, d);
            } // for
            f((void *) pass->annotations, d);
        } // for
        f((void *) technique->passes, d);
        for (j = 0; j < technique->annotation_count; j++)
        {
            freevalue(&technique->annotations[j], f, d);
        } // for
        f((void *) technique->annotations, d);
    } // for
    f((void *) effect->techniques, d);

    /* Free object table */
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
                MOJOSHADER_freePreshader(object->shader.preshader);
            else
                MOJOSHADER_freeParseData(object->shader.shader);
            f((void *) object->shader.params, d);
            f((void *) object->shader.samplers, d);
            f((void *) object->shader.preshader_params, d);
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
            f((void *) object->mapping.name, d);
        else if (object->type == MOJOSHADER_SYMTYPE_STRING)
            f((void *) object->string.string, d);
    } // for
    f((void *) effect->objects, d);

    /* Free base effect structure */
    f((void *) effect, d);
}